

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_enc_sigpass_step
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 bpno,OPJ_INT32 one,
               OPJ_INT32 *nmsedec,OPJ_BYTE type,OPJ_UINT32 ci,OPJ_UINT32 vsc)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  OPJ_INT16 OVar4;
  uint uVar5;
  OPJ_UINT32 lu_00;
  OPJ_UINT32 x;
  OPJ_UINT32 spb;
  OPJ_UINT32 ctxt2;
  OPJ_UINT32 lu;
  OPJ_UINT32 ctxt1;
  OPJ_UINT32 flags;
  opj_mqc_t *mqc;
  OPJ_UINT32 v;
  OPJ_INT32 *nmsedec_local;
  OPJ_INT32 one_local;
  OPJ_INT32 bpno_local;
  OPJ_INT32 *datap_local;
  opj_flag_t *flagsp_local;
  opj_t1_t *t1_local;
  
  uVar5 = *flagsp;
  cVar2 = (char)ci;
  if (((uVar5 & 0x200010 << (cVar2 * '\x03' & 0x1fU)) == 0) &&
     ((uVar5 & 0x1ef << (cVar2 * '\x03' & 0x1fU)) != 0)) {
    bVar3 = opj_t1_getctxno_zc(&t1->mqc,uVar5 >> (cVar2 * '\x03' & 0x1fU));
    uVar5 = opj_int_abs(*datap);
    uVar5 = (uint)((uVar5 & one) != 0);
    (t1->mqc).curctx = (t1->mqc).ctxs + bVar3;
    if (type == '\x01') {
      opj_mqc_bypass_enc(&t1->mqc,uVar5);
    }
    else {
      opj_mqc_encode(&t1->mqc,uVar5);
    }
    if (uVar5 != 0) {
      lu_00 = opj_t1_getctxtno_sc_or_spb_index(*flagsp,flagsp[-1],flagsp[1],ci);
      bVar3 = opj_t1_getctxno_sc(lu_00);
      iVar1 = *datap;
      uVar5 = (uint)(iVar1 < 0);
      x = opj_int_abs(*datap);
      OVar4 = opj_t1_getnmsedec_sig(x,bpno);
      *nmsedec = (int)OVar4 + *nmsedec;
      (t1->mqc).curctx = (t1->mqc).ctxs + bVar3;
      if (type == '\x01') {
        opj_mqc_bypass_enc(&t1->mqc,uVar5);
      }
      else {
        bVar3 = opj_t1_getspb(lu_00);
        opj_mqc_encode(&t1->mqc,(uint)(iVar1 < 0 ^ bVar3));
      }
      opj_t1_update_flags(flagsp,ci,uVar5,t1->w + 2,vsc);
    }
    *flagsp = 0x200000 << (cVar2 * '\x03' & 0x1fU) | *flagsp;
  }
  return;
}

Assistant:

static INLINE void opj_t1_enc_sigpass_step(opj_t1_t *t1,
        opj_flag_t *flagsp,
        OPJ_INT32 *datap,
        OPJ_INT32 bpno,
        OPJ_INT32 one,
        OPJ_INT32 *nmsedec,
        OPJ_BYTE type,
        OPJ_UINT32 ci,
        OPJ_UINT32 vsc)
{
    OPJ_UINT32 v;

    opj_mqc_t *mqc = &(t1->mqc);   /* MQC component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        OPJ_UINT32 ctxt1 = opj_t1_getctxno_zc(mqc, flags >> (ci * 3U));
        v = (opj_int_abs(*datap) & one) ? 1 : 0;
#ifdef DEBUG_ENC_SIG
        fprintf(stderr, "   ctxt1=%d\n", ctxt1);
#endif
        opj_mqc_setcurctx(mqc, ctxt1);
        if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
            opj_mqc_bypass_enc(mqc, v);
        } else {
            opj_mqc_encode(mqc, v);
        }
        if (v) {
            OPJ_UINT32 lu = opj_t1_getctxtno_sc_or_spb_index(
                                *flagsp,
                                flagsp[-1], flagsp[1],
                                ci);
            OPJ_UINT32 ctxt2 = opj_t1_getctxno_sc(lu);
            v = *datap < 0 ? 1U : 0U;
            *nmsedec += opj_t1_getnmsedec_sig((OPJ_UINT32)opj_int_abs(*datap),
                                              (OPJ_UINT32)bpno);
#ifdef DEBUG_ENC_SIG
            fprintf(stderr, "   ctxt2=%d\n", ctxt2);
#endif
            opj_mqc_setcurctx(mqc, ctxt2);
            if (type == T1_TYPE_RAW) {  /* BYPASS/LAZY MODE */
                opj_mqc_bypass_enc(mqc, v);
            } else {
                OPJ_UINT32 spb = opj_t1_getspb(lu);
#ifdef DEBUG_ENC_SIG
                fprintf(stderr, "   spb=%d\n", spb);
#endif
                opj_mqc_encode(mqc, v ^ spb);
            }
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}